

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_bit_is_set(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                    lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set_type lVar1;
  LYS_NODE LVar2;
  lyxp_set *plVar3;
  int iVar4;
  int iVar5;
  lys_node *plVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ly_ctx *plVar10;
  undefined8 uVar11;
  lyd_node *plVar12;
  
  plVar3 = *args;
  lVar1 = plVar3->type;
  if ((options & 0x1cU) == 0) {
    if (LYXP_SET_NODE_SET < lVar1) {
      if (lVar1 < (LYXP_SET_NUMBER|LYXP_SET_SNODE_SET)) {
        uVar11 = *(undefined8 *)(&DAT_001ced58 + (ulong)lVar1 * 8);
      }
      else {
        uVar11 = 0;
      }
      ly_vlog(param_4->ctx,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,uVar11,
              "bit-is-set(node-set, string)");
      return -1;
    }
    iVar4 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar4 != 0) {
      return -1;
    }
    set_free_content(set);
    set->type = LYXP_SET_BOOLEAN;
    (set->val).bool = 0;
    if ((*args)->type != LYXP_SET_NODE_SET) {
      return 0;
    }
    plVar12 = (((*args)->val).nodes)->node;
    plVar6 = plVar12->schema;
    if ((plVar6->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      return 0;
    }
    if (*(int *)&plVar6[1].ref != 2) {
      return 0;
    }
    LVar2 = plVar6[1].nodetype;
    if ((long)(int)LVar2 < 1) {
      return 0;
    }
    lVar9 = 0;
    while ((plVar6 = (&plVar12->child->schema)[lVar9], plVar6 == (lys_node *)0x0 ||
           (iVar4 = ly_strequal_(plVar6->name,(args[1]->val).str), iVar4 == 0))) {
      lVar9 = lVar9 + 1;
      if ((int)LVar2 == lVar9) {
        return 0;
      }
    }
    set_free_content(set);
    set->type = LYXP_SET_BOOLEAN;
    (set->val).bool = 1;
    return 0;
  }
  if (lVar1 == LYXP_SET_SNODE_SET) {
    uVar7 = plVar3->used;
    plVar12 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar3->val).nodes[uVar7].pos == 1) {
        plVar12 = (plVar3->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    if (plVar12 == (lyd_node *)0x0) goto LAB_00182b61;
    if ((*(LYS_NODE *)&plVar12->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar10 = param_4->ctx;
      plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar12->ht);
      pcVar8 = "Argument #1 of %s is a %s node \"%s\".";
LAB_00182bed:
      iVar4 = 1;
      ly_log(plVar10,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_bit_is_set",plVar6);
    }
    else {
      iVar5 = warn_is_specific_type((lys_type *)&plVar12[1].ht,LY_TYPE_BITS);
      iVar4 = 0;
      if (iVar5 == 0) {
        plVar10 = param_4->ctx;
        plVar6 = plVar12->schema;
        pcVar8 = "Argument #1 of %s is node \"%s\", not of type \"bits\".";
        goto LAB_00182bed;
      }
    }
  }
  else {
LAB_00182b61:
    iVar4 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_bit_is_set");
  }
  plVar3 = args[1];
  if (plVar3->type == LYXP_SET_SNODE_SET) {
    uVar7 = plVar3->used;
    plVar12 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar3->val).nodes[uVar7].pos == 1) {
        plVar12 = (plVar3->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    if (plVar12 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar12->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar10 = param_4->ctx;
        plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar12->ht);
        pcVar8 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        iVar5 = warn_is_string_type((lys_type *)&plVar12[1].ht);
        if (iVar5 != 0) goto LAB_00182ca2;
        plVar10 = param_4->ctx;
        plVar6 = plVar12->schema;
        pcVar8 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      iVar4 = 1;
      ly_log(plVar10,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_bit_is_set",plVar6);
    }
  }
LAB_00182ca2:
  uVar7 = set->used;
  if ((ulong)uVar7 != 0) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar9) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar9);
  }
  return iVar4;
}

Assistant:

static int
xpath_bit_is_set(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                 struct lyxp_set *set, int options)
{
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int i, bits_count, ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_BITS)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"bits\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "bit-is-set(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type == LYXP_SET_NODE_SET) {
        leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[0].node;
        if ((leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                && (((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_BITS)) {
            bits_count = ((struct lys_node_leaf *)leaf->schema)->type.info.bits.count;
            for (i = 0; i < bits_count; ++i) {
                if (leaf->value.bit[i] && ly_strequal(leaf->value.bit[i]->name, args[1]->val.str, 0)) {
                    set_fill_boolean(set, 1);
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}